

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp-wasm-c-api.cc
# Opt level: O1

ValueType ToWabtValueType(wasm_valkind_t kind)

{
  ValueType VVar1;
  ValueType VVar2;
  ValueType VVar3;
  ValueType VVar4;
  ValueType VVar5;
  ValueType VVar6;
  int iVar7;
  undefined7 in_register_00000039;
  ValueType *pVVar8;
  undefined7 extraout_var;
  
  VVar1.enum_ = ExternRef;
  VVar1.type_index_ = 0;
  iVar7 = (int)CONCAT71(in_register_00000039,kind);
  switch(CONCAT71(in_register_00000039,kind) & 0xffffffff) {
  case 0:
    VVar1.enum_ = I32;
    VVar1.type_index_ = 0;
    break;
  case 1:
    VVar5.enum_ = I64;
    VVar5.type_index_ = 0;
    return VVar5;
  case 2:
    VVar3.enum_ = F32;
    VVar3.type_index_ = 0;
    return VVar3;
  case 3:
    VVar4.enum_ = F64;
    VVar4.type_index_ = 0;
    return VVar4;
  default:
    if (iVar7 != 0x80) {
      if (iVar7 == 0x81) {
        VVar2.enum_ = FuncRef;
        VVar2.type_index_ = 0;
        return VVar2;
      }
      pVVar8 = (ValueType *)(ulong)kind;
      ToWabtValueType();
      if (pVVar8 == (ValueType *)0x0) {
        __assert_fail("type",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/interp/interp-wasm-c-api.cc"
                      ,0x219,"wasm_valkind_t wasm_valtype_kind(const wasm_valtype_t *)");
      }
      VVar6.enum_._0_1_ = FromWabtValueType(*pVVar8);
      VVar6._1_7_ = extraout_var;
      return VVar6;
    }
  }
  return VVar1;
}

Assistant:

static ValueType ToWabtValueType(wasm_valkind_t kind) {
  switch (kind) {
    case WASM_I32:
      return ValueType::I32;
    case WASM_I64:
      return ValueType::I64;
    case WASM_F32:
      return ValueType::F32;
    case WASM_F64:
      return ValueType::F64;
    case WASM_ANYREF:
      return ValueType::ExternRef;
    case WASM_FUNCREF:
      return ValueType::FuncRef;
    default:
      TRACE("unexpected wasm_valkind_t: %d", kind);
      WABT_UNREACHABLE;
  }
  WABT_UNREACHABLE;
}